

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *pcVar1;
  MapSourceFileFlags *pMVar2;
  cmGeneratedFileStream *pcVar3;
  bool bVar4;
  __type _Var5;
  TargetType TVar6;
  string *psVar7;
  const_reference ppcVar8;
  char *pcVar9;
  char *pcVar10;
  reference ppcVar11;
  cmMakefile *pcVar12;
  GeneratorTargetVector *this_00;
  pointer pcVar13;
  string *__rhs;
  string_view sVar14;
  cmAlphaNum local_200;
  cmAlphaNum local_1d0;
  undefined1 local_1a0 [8];
  string fastTarget;
  undefined1 local_150 [8];
  string targetName;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  GeneratorTargetVector *targets;
  cmMakefile *makefile;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90 [8];
  string compiler;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *make;
  MapSourceFileFlags *sourceFileFlags_local;
  cmGeneratedFileStream *fout_local;
  cmMakefile *mf_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  make = (string *)sourceFileFlags;
  sourceFileFlags_local = (MapSourceFileFlags *)fout;
  fout_local = (cmGeneratedFileStream *)mf;
  mf_local = (cmMakefile *)lgs;
  lgs_local = (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_MAKE_PROGRAM",&local_59);
  psVar7 = cmMakefile::GetRequiredDefinition(mf,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = psVar7;
  std::__cxx11::string::string(local_90);
  bVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                    ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local);
  pMVar2 = sourceFileFlags_local;
  if (!bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"all",&local_b1);
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local
                         ,0);
    pcVar1 = *ppcVar8;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pcVar3 = fout_local;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmGeneratedFileStream *)pMVar2,&local_b0,pcVar1,(cmGeneratorTarget *)0x0,
                 pcVar9,(cmMakefile *)pcVar3,pcVar10,(MapSourceFileFlags *)make,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pMVar2 = sourceFileFlags_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"clean",(allocator<char> *)((long)&__range1 + 7));
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local
                         ,0);
    pcVar1 = *ppcVar8;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pcVar3 = fout_local;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmGeneratedFileStream *)pMVar2,&local_d8,pcVar1,(cmGeneratorTarget *)0x0,
                 pcVar9,(cmMakefile *)pcVar3,pcVar10,(MapSourceFileFlags *)make,false);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  pcVar12 = mf_local;
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                 ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)pcVar12);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar4) {
    ppcVar11 = __gnu_cxx::
               __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
               ::operator*(&__end1);
    pcVar1 = *ppcVar11;
    pcVar12 = cmLocalGenerator::GetMakefile(pcVar1);
    this_00 = cmLocalGenerator::GetGeneratorTargets(pcVar1);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_00);
    target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
             std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&target), bVar4) {
      targetName.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
           ::operator*(&__end2);
      pcVar13 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )targetName.field_2._8_8_);
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar13);
      std::__cxx11::string::string((string *)local_150,(string *)psVar7);
      pcVar13 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )targetName.field_2._8_8_);
      TVar6 = cmGeneratorTarget::GetType(pcVar13);
      pMVar2 = sourceFileFlags_local;
      if (TVar6 < UTILITY) {
        pcVar13 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                            ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              *)targetName.field_2._8_8_);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)local_150,pcVar1,pcVar13,pcVar9,
                     pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        cmAlphaNum::cmAlphaNum(&local_1d0,(string *)local_150);
        cmAlphaNum::cmAlphaNum(&local_200,"/fast");
        cmStrCat<>((string *)local_1a0,&local_1d0,&local_200);
        pMVar2 = sourceFileFlags_local;
        pcVar13 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                            ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              *)targetName.field_2._8_8_);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)local_1a0,pcVar1,pcVar13,pcVar9,
                     pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        std::__cxx11::string::~string((string *)local_1a0);
      }
      else if (TVar6 == UTILITY) {
        sVar14 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
        bVar4 = cmHasLiteralPrefix<8ul>(sVar14,(char (*) [8])"Nightly");
        if ((!bVar4) ||
           (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_150,"Nightly"), !bVar4)) {
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
          bVar4 = cmHasLiteralPrefix<11ul>(sVar14,(char (*) [11])"Continuous");
          if ((!bVar4) ||
             (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_150,"Continuous"), !bVar4)) {
            sVar14 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
            fastTarget.field_2._8_8_ = sVar14._M_len;
            bVar4 = cmHasLiteralPrefix<13ul>(sVar14,(char (*) [13])"Experimental");
            if ((!bVar4) ||
               (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_150,"Experimental"), !bVar4)) {
              pMVar2 = sourceFileFlags_local;
              pcVar9 = (char *)std::__cxx11::string::c_str();
              pcVar10 = (char *)std::__cxx11::string::c_str();
              AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)local_150,pcVar1,
                           (cmGeneratorTarget *)0x0,pcVar9,pcVar12,pcVar10,
                           (MapSourceFileFlags *)make,false);
            }
          }
        }
      }
      else if (TVar6 == GLOBAL_TARGET) {
        psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
        __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar1);
        _Var5 = std::operator==(psVar7,__rhs);
        pMVar2 = sourceFileFlags_local;
        if (_Var5) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)local_150,pcVar1,
                       (cmGeneratorTarget *)0x0,pcVar9,pcVar12,pcVar10,(MapSourceFileFlags *)make,
                       false);
        }
      }
      std::__cxx11::string::~string((string *)local_150);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}